

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

void prvTidyParseBody(TidyDocImpl *doc,Node *body,GetTokenMode mode)

{
  Node **ppNVar1;
  Lexer *pLVar2;
  Node *pNVar3;
  bool bVar4;
  GetTokenMode GVar5;
  Bool BVar6;
  int iVar7;
  Node *node;
  Dict *pDVar8;
  uint uVar9;
  Dict *pDVar10;
  Node **ppNVar11;
  GetTokenMode mode_00;
  TidyTagId TVar12;
  uint vers;
  bool bVar13;
  
  pLVar2 = doc->lexer;
  prvTidyBumpObject(doc,body->parent);
  node = prvTidyGetToken(doc,IgnoreWhitespace);
  if (node != (Node *)0x0) {
    ppNVar1 = &body->content;
    bVar4 = true;
    mode_00 = IgnoreWhitespace;
    do {
      pDVar8 = node->tag;
      pDVar10 = body->tag;
      if ((pDVar8 == pDVar10) && (node->type == StartTag)) {
LAB_00141dd8:
        prvTidyReport(doc,body,node,0x235);
LAB_00141ded:
        prvTidyFreeNode(doc,node);
      }
      else {
        if ((pDVar8 != (Dict *)0x0) && (pDVar8->id == TidyTag_HTML)) {
          BVar6 = prvTidynodeIsElement(node);
          if ((BVar6 == no) && (pLVar2->seenEndHtml == no)) {
            pLVar2->seenEndHtml = yes;
            goto LAB_00141ded;
          }
          goto LAB_00141dd8;
        }
        if ((pLVar2->seenEndBody != no) && (node->type - StartTag < 3)) {
          prvTidyReport(doc,body,node,0x233);
          pDVar8 = node->tag;
          pDVar10 = body->tag;
        }
        if ((pDVar8 != pDVar10) || (node->type != EndTag)) {
          if (pDVar8 != (Dict *)0x0) {
            if (pDVar8->id - TidyTag_FRAME < 2) {
LAB_00141e94:
              if (((body->parent != (Node *)0x0) &&
                  (pDVar8 = body->parent->tag, pDVar8 != (Dict *)0x0)) &&
                 (pDVar8->id == TidyTag_NOFRAMES)) {
                TrimSpaces(doc,body);
                goto LAB_00142319;
              }
            }
            else if (pDVar8->id == TidyTag_NOFRAMES) {
              if (node->type == EndTag) goto LAB_00141e94;
              if (node->type == StartTag) {
                node->parent = body;
                pNVar3 = body->last;
                node->prev = pNVar3;
                ppNVar11 = &pNVar3->next;
                if (pNVar3 == (Node *)0x0) {
                  ppNVar11 = ppNVar1;
                }
                *ppNVar11 = node;
                body->last = node;
                prvTidyParseBlock(doc,node,mode_00);
                goto LAB_00141f29;
              }
            }
          }
          BVar6 = prvTidynodeIsText(node);
          if ((BVar6 == no) || (node->start + 1 < node->end)) {
            bVar13 = false;
          }
          else {
            bVar13 = pLVar2->lexbuf[node->start] == ' ';
          }
          BVar6 = InsertMisc(body,node);
          if (BVar6 != no) goto LAB_00141f29;
          BVar6 = prvTidynodeIsText(node);
          if (BVar6 != no) {
            if ((bool)(bVar13 ^ 1) || mode_00 != IgnoreWhitespace) {
              prvTidyConstrainVersion(doc,0xfffffeda);
              if (bVar4) {
                iVar7 = prvTidyInlineDup(doc,node);
                bVar4 = false;
                if (0 < iVar7) goto LAB_00141f29;
              }
              node->parent = body;
              pNVar3 = body->last;
              node->prev = pNVar3;
              ppNVar11 = &pNVar3->next;
              if (pNVar3 == (Node *)0x0) {
                ppNVar11 = ppNVar1;
              }
              *ppNVar11 = node;
              body->last = node;
              bVar4 = false;
              mode_00 = MixedContent;
            }
            else {
              prvTidyFreeNode(doc,node);
              mode_00 = IgnoreWhitespace;
            }
            goto LAB_00141f29;
          }
          if (node->type == DocTypeTag) {
            InsertDocType(doc,body,node);
            goto LAB_00141f29;
          }
          if ((node->tag == (Dict *)0x0) || (TVar12 = node->tag->id, TVar12 == TidyTag_PARAM))
          goto LAB_00141dd8;
          pLVar2->excludeBlocks = no;
          if (((TVar12 != TidyTag_INPUT) &&
              ((BVar6 = prvTidynodeHasCM(node,8), BVar6 != no ||
               (BVar6 = prvTidynodeHasCM(node,0x10), BVar6 != no)))) ||
             (BVar6 = prvTidyIsHTML5Mode(doc), BVar6 != no)) {
LAB_00142163:
            if (node->type == EndTag) {
              if (node->tag == (Dict *)0x0) {
LAB_00142189:
                BVar6 = prvTidynodeHasCM(node,0x10);
                if (BVar6 != no) {
                  prvTidyPopInline(doc,node);
                }
              }
              else {
                TVar12 = node->tag->id;
                if (TVar12 == TidyTag_P) {
                  node->type = StartEndTag;
                  node->implicit = yes;
                }
                else {
                  if (TVar12 != TidyTag_BR) goto LAB_00142189;
                  node->type = StartTag;
                }
              }
            }
            BVar6 = prvTidynodeIsElement(node);
            if (BVar6 != no) {
              if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_MAIN)) ||
                 (BVar6 = prvTidyFindNodeWithId((doc->root).content,TidyTag_MAIN), BVar6 == no)) {
                BVar6 = prvTidynodeHasCM(node,0x10);
                if (BVar6 == no) {
                  bVar4 = true;
                  GVar5 = IgnoreWhitespace;
                }
                else {
                  if ((node->tag == (Dict *)0x0) ||
                     (vers = 0xfffffedb, node->tag->id != TidyTag_IMG)) {
                    vers = 0xfffffeda;
                  }
                  prvTidyConstrainVersion(doc,vers);
                  if (bVar4) {
                    GVar5 = MixedContent;
                    if (node->implicit == no) {
                      iVar7 = prvTidyInlineDup(doc,node);
                      bVar4 = false;
                      if (0 < iVar7) goto LAB_00141f29;
                    }
                    else {
                      bVar4 = true;
                    }
                  }
                  else {
                    bVar4 = false;
                    GVar5 = MixedContent;
                  }
                }
                mode_00 = GVar5;
                if (node->implicit != no) {
                  prvTidyReport(doc,body,node,0x247);
                }
                node->parent = body;
                pNVar3 = body->last;
                node->prev = pNVar3;
                ppNVar11 = &pNVar3->next;
                if (pNVar3 == (Node *)0x0) {
                  ppNVar11 = ppNVar1;
                }
                *ppNVar11 = node;
                body->last = node;
                ParseTag(doc,node,mode_00);
                goto LAB_00141f29;
              }
              *(byte *)&doc->badForm = (byte)doc->badForm | 2;
            }
            goto LAB_00141dd8;
          }
          pDVar8 = node->tag;
          uVar9 = pDVar8->model;
          if ((uVar9 & 4) == 0) {
            prvTidyReport(doc,body,node,0x27e);
            pDVar8 = node->tag;
            uVar9 = pDVar8->model;
          }
          if ((uVar9 & 2) == 0) {
            if ((uVar9 & 4) != 0) {
              MoveToHead(doc,body,node);
              goto LAB_00141f29;
            }
            if ((uVar9 & 0x20) == 0) {
              if ((uVar9 & 0x40) == 0) {
                if ((uVar9 & 0x380) == 0) {
                  if (pDVar8->id != TidyTag_INPUT) {
                    BVar6 = prvTidynodeHasCM(node,0x600);
                    if (BVar6 == no) {
LAB_00142319:
                      prvTidyUngetToken(doc);
                      return;
                    }
                    goto LAB_00141ded;
                  }
                  prvTidyUngetToken(doc);
                  TVar12 = TidyTag_FORM;
                }
                else {
                  if (node->type == EndTag) goto LAB_0014215b;
                  prvTidyUngetToken(doc);
                  TVar12 = TidyTag_TABLE;
                }
              }
              else {
                prvTidyUngetToken(doc);
                TVar12 = TidyTag_DL;
              }
              node = prvTidyInferredTag(doc,TVar12);
            }
            else {
              prvTidyUngetToken(doc);
              node = prvTidyInferredTag(doc,TidyTag_UL);
              AddClassNoIndent(doc,node);
            }
LAB_0014215b:
            pLVar2->excludeBlocks = yes;
            goto LAB_00142163;
          }
          if (((pDVar8->id == TidyTag_BODY) && (body->implicit != no)) &&
             (body->attributes == (AttVal *)0x0)) {
            body->attributes = node->attributes;
            node->attributes = (AttVal *)0x0;
          }
          goto LAB_00141ded;
        }
        body->closed = yes;
        TrimSpaces(doc,body);
        prvTidyFreeNode(doc,node);
        pLVar2->seenEndBody = yes;
        mode_00 = IgnoreWhitespace;
        if (((body->parent != (Node *)0x0) &&
            (pDVar8 = body->parent->tag, mode_00 = IgnoreWhitespace, pDVar8 != (Dict *)0x0)) &&
           (pDVar8->id == TidyTag_NOFRAMES)) {
          return;
        }
      }
LAB_00141f29:
      node = prvTidyGetToken(doc,mode_00);
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(ParseBody)(TidyDocImpl* doc, Node *body, GetTokenMode mode)
{
    Lexer* lexer = doc->lexer;
    Node *node;
    Bool checkstack, iswhitenode;

    mode = IgnoreWhitespace;
    checkstack = yes;

    TY_(BumpObject)( doc, body->parent );

    DEBUG_LOG(SPRTF("Enter ParseBody...\n"));
    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        /* find and discard multiple <body> elements */
        if (node->tag == body->tag && node->type == StartTag)
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)(doc, node);
            continue;
        }

        /* #538536 Extra endtags not detected */
        if ( nodeIsHTML(node) )
        {
            if (TY_(nodeIsElement)(node) || lexer->seenEndHtml) 
                TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            else
                lexer->seenEndHtml = 1;

            TY_(FreeNode)( doc, node);
            continue;
        }

        if ( lexer->seenEndBody && 
             ( node->type == StartTag ||
               node->type == EndTag   ||
               node->type == StartEndTag ) )
        {
            TY_(Report)(doc, body, node, CONTENT_AFTER_BODY );
        }

        if ( node->tag == body->tag && node->type == EndTag )
        {
            body->closed = yes;
            TrimSpaces(doc, body);
            TY_(FreeNode)( doc, node);
            lexer->seenEndBody = 1;
            mode = IgnoreWhitespace;

            if ( nodeIsNOFRAMES(body->parent) )
                break;

            continue;
        }

        if ( nodeIsNOFRAMES(node) )
        {
            if (node->type == StartTag)
            {
                TY_(InsertNodeAtEnd)(body, node);
                TY_(ParseBlock)(doc, node, mode);
                continue;
            }

            if (node->type == EndTag && nodeIsNOFRAMES(body->parent) )
            {
                TrimSpaces(doc, body);
                TY_(UngetToken)( doc );
                break;
            }
        }

        if ( (nodeIsFRAME(node) || nodeIsFRAMESET(node))
             && nodeIsNOFRAMES(body->parent) )
        {
            TrimSpaces(doc, body);
            TY_(UngetToken)( doc );
            break;
        }
        
        iswhitenode = no;

        if ( TY_(nodeIsText)(node) &&
             node->end <= node->start + 1 &&
             lexer->lexbuf[node->start] == ' ' )
            iswhitenode = yes;

        /* deal with comments etc. */
        if (InsertMisc(body, node))
            continue;

        /* mixed content model permits text */
        if (TY_(nodeIsText)(node))
        {
            if (iswhitenode && mode == IgnoreWhitespace)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            /* HTML 2 and HTML4 strict don't allow text here */
            TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT | VERS_HTML20));

            if (checkstack)
            {
                checkstack = no;

                if ( TY_(InlineDup)(doc, node) > 0 )
                    continue;
            }

            TY_(InsertNodeAtEnd)(body, node);
            mode = MixedContent;
            continue;
        }

        if (node->type == DocTypeTag)
        {
            InsertDocType(doc, body, node);
            continue;
        }
        /* discard unknown  and PARAM tags */
        if ( node->tag == NULL || nodeIsPARAM(node) )
        {
            TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /*
          Netscape allows LI and DD directly in BODY
          We infer UL or DL respectively and use this
          Bool to exclude block-level elements so as
          to match Netscape's observed behaviour.
        */
        lexer->excludeBlocks = no;
        
        if (( nodeIsINPUT(node) ||
             (!TY_(nodeHasCM)(node, CM_BLOCK) && !TY_(nodeHasCM)(node, CM_INLINE))
           ) && !TY_(IsHTML5Mode)(doc) )
        {
            /* avoid this error message being issued twice */
            if (!(node->tag->model & CM_HEAD))
                TY_(Report)(doc, body, node, TAG_NOT_ALLOWED_IN);

            if (node->tag->model & CM_HTML)
            {
                /* copy body attributes if current body was inferred */
                if ( nodeIsBODY(node) && body->implicit 
                     && body->attributes == NULL )
                {
                    body->attributes = node->attributes;
                    node->attributes = NULL;
                }

                TY_(FreeNode)( doc, node);
                continue;
            }

            if (node->tag->model & CM_HEAD)
            {
                MoveToHead(doc, body, node);
                continue;
            }

            if (node->tag->model & CM_LIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_UL);
                AddClassNoIndent(doc, node);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & CM_DEFLIST)
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_DL);
                lexer->excludeBlocks = yes;
            }
            else if (node->tag->model & (CM_TABLE | CM_ROWGRP | CM_ROW))
            {
                /* http://tidy.sf.net/issue/2855621 */
                if (node->type != EndTag) {
                    TY_(UngetToken)( doc );
                    node = TY_(InferredTag)(doc, TidyTag_TABLE);
                }
                lexer->excludeBlocks = yes;
            }
            else if ( nodeIsINPUT(node) )
            {
                TY_(UngetToken)( doc );
                node = TY_(InferredTag)(doc, TidyTag_FORM);
                lexer->excludeBlocks = yes;
            }
            else
            {
                if ( !TY_(nodeHasCM)(node, CM_ROW | CM_FIELD) )
                {
                    TY_(UngetToken)( doc );
                    return;
                }

                /* ignore </td> </th> <option> etc. */
                TY_(FreeNode)( doc, node );
                continue;
            }
        }

        if (node->type == EndTag)
        {
            if ( nodeIsBR(node) )
                node->type = StartTag;
            else if ( nodeIsP(node) )
            {
                node->type = StartEndTag;
                node->implicit = yes;
            }
            else if ( TY_(nodeHasCM)(node, CM_INLINE) )
                TY_(PopInline)( doc, node );
        }

        if (TY_(nodeIsElement)(node))
        {
            if (nodeIsMAIN(node)) {
                /*\ Issue #166 - repeated <main> element
                 *  How to efficiently search for a previous main element?
                \*/
                if ( TY_(FindNodeById)(doc, TidyTag_MAIN) )
                {
                    doc->badForm |= flg_BadMain; /* this is an ERROR in format */
                    TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
                    TY_(FreeNode)( doc, node);
                    continue;
                }
            }
            /* Issue #20 - merging from Ger Hobbelt fork put back CM_MIXED, which had been
               removed to fix this issue - reverting to fix 880221e
             */
            if ( TY_(nodeHasCM)(node, CM_INLINE) )
            {
                /* HTML4 strict doesn't allow inline content here */
                /* but HTML2 does allow img elements as children of body */
                if ( nodeIsIMG(node) )
                    TY_(ConstrainVersion)(doc, ~VERS_HTML40_STRICT);
                else
                    TY_(ConstrainVersion)(doc, ~(VERS_HTML40_STRICT|VERS_HTML20));

                if (checkstack && !node->implicit)
                {
                    checkstack = no;

                    if ( TY_(InlineDup)(doc, node) > 0 )
                        continue;
                }

                mode = MixedContent;
            }
            else
            {
                checkstack = yes;
                mode = IgnoreWhitespace;
            }

            if (node->implicit)
                TY_(Report)(doc, body, node, INSERTING_TAG);

            TY_(InsertNodeAtEnd)(body, node);
            ParseTag(doc, node, mode);
            continue;
        }

        /* discard unexpected tags */
        TY_(Report)(doc, body, node, DISCARDING_UNEXPECTED);
        TY_(FreeNode)( doc, node);
    }
    DEBUG_LOG(SPRTF("Exit ParseBody 1...\n"));
}